

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflickgesture.cpp
# Opt level: O3

void __thiscall PressDelayHandler::~PressDelayHandler(PressDelayHandler *this)

{
  QMouseEvent *pQVar1;
  Data *pDVar2;
  
  *(undefined ***)this = &PTR_metaObject_00815980;
  pDVar2 = (this->mouseTarget).wp.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if (*(int *)pDVar2 == 0) {
      pDVar2 = (this->mouseTarget).wp.d;
      if (pDVar2 == (Data *)0x0) {
        pDVar2 = (Data *)0x0;
      }
      operator_delete(pDVar2);
    }
  }
  pQVar1 = (this->pressDelayEvent).d;
  if (pQVar1 != (QMouseEvent *)0x0) {
    (**(code **)(*(long *)pQVar1 + 8))();
  }
  if ((this->pressDelayTimer).m_id != Invalid) {
    QBasicTimer::stop();
  }
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

PressDelayHandler(QObject *parent = nullptr)
        : QObject(parent)
        , sendingEvent(false)
        , mouseButton(Qt::NoButton)
        , mouseTarget(nullptr)
        , mouseEventSource(Qt::MouseEventNotSynthesized)
    { }